

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O3

int Test_SUNMatCopy(SUNMatrix A,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix A_00;
  
  A_00 = (SUNMatrix)SUNMatClone();
  uVar1 = SUNMatCopy(A,A_00);
  sync_device(A);
  if (uVar1 == 0) {
    iVar2 = check_matrix(A_00,A,2.220446049250313e-15);
    if (iVar2 == 0) {
      if (print_all_ranks == 0 && myid == 0) {
LAB_0010205c:
        puts("    PASSED test -- SUNMatCopy ");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",myid);
        goto LAB_0010205c;
      }
      iVar2 = 0;
      if (myid != 0) goto LAB_00102089;
    }
    else {
      if (print_all_ranks == 0 && myid == 0) {
LAB_0010202e:
        puts(">>> FAILED test -- SUNMatCopy ");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",myid);
        goto LAB_0010202e;
      }
      iVar2 = 1;
    }
    if (print_time != 0) {
      printf("    SUNMatCopy Time: %22.15e \n \n",0);
    }
    goto LAB_00102089;
  }
  if (print_all_ranks == 0 && myid == 0) {
LAB_00101fdb:
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
  }
  else if (print_all_ranks != 0) {
    printf("process %06d: ",myid);
    goto LAB_00101fdb;
  }
  iVar2 = 1;
LAB_00102089:
  SUNMatDestroy(A_00);
  return iVar2;
}

Assistant:

int Test_SUNMatCopy(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;

  B = SUNMatClone(A);

  /* copy matrix data */
  start_time = get_time();
  failure    = SUNMatCopy(A, B);
  sync_device(A);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* check matrix entries */
  failure = check_matrix(B, A, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatCopy \n", myid);
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatCopy \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}